

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

bool __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::isMeshInterfaceVar
          (BuiltInsValidator *this,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  pointer pEVar3;
  uint32_t *puVar4;
  uint id;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar5;
  _Rb_tree_header *p_Var6;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar7;
  Instruction *pIVar8;
  _Base_ptr p_Var9;
  pointer pEVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  size_t index;
  uint32_t *puVar13;
  ValidationState_t *this_00;
  uint32_t *puVar14;
  bool bVar15;
  
  puVar14 = (this->_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar14 == puVar2) {
      return false;
    }
    uVar1 = *puVar14;
    psVar5 = ValidationState_t::GetExecutionModels(this->_,uVar1);
    p_Var9 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var9 != (_Base_ptr)0x0) {
      p_Var6 = &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var6->_M_header;
      p_Var12 = p_Var9;
      do {
        bVar15 = p_Var12[1]._M_color < 0x14f5;
        if (!bVar15) {
          p_Var11 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[bVar15];
      } while (p_Var12 != (_Base_ptr)0x0);
      p_Var12 = &p_Var6->_M_header;
      if (((_Rb_tree_header *)p_Var11 == p_Var6) || (0x14f5 < p_Var11[1]._M_color)) {
        do {
          bVar15 = p_Var9[1]._M_color < 0x1494;
          if (!bVar15) {
            p_Var12 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[bVar15];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var12 == p_Var6) || (0x1494 < p_Var12[1]._M_color))
        goto LAB_0063a536;
      }
      pvVar7 = ValidationState_t::entry_point_descriptions(this->_,uVar1);
      pEVar3 = (pvVar7->
               super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pEVar10 = (pvVar7->
                     super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                     )._M_impl.super__Vector_impl_data._M_start; pEVar10 != pEVar3;
          pEVar10 = pEVar10 + 1) {
        puVar4 = (pEVar10->interfaces).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar13 = (pEVar10->interfaces).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar13 != puVar4; puVar13 = puVar13 + 1) {
          if ((inst->inst_).opcode == 0x1e) {
            pIVar8 = ValidationState_t::FindDef(this->_,*puVar13);
            uVar1 = (inst->inst_).result_id;
            pIVar8 = ValidationState_t::FindDef(this->_,(pIVar8->inst_).type_id);
            this_00 = this->_;
            index = 2;
            while( true ) {
              id = Instruction::GetOperandAs<unsigned_int>(pIVar8,index);
              pIVar8 = ValidationState_t::FindDef(this_00,id);
              if ((pIVar8->inst_).opcode != 0x1c) break;
              this_00 = this->_;
              index = 1;
            }
            if (uVar1 == (pIVar8->inst_).result_id) {
              return true;
            }
          }
          else if ((inst->inst_).result_id == *puVar13) {
            return true;
          }
        }
      }
    }
LAB_0063a536:
    puVar14 = puVar14 + 1;
  } while( true );
}

Assistant:

bool isMeshInterfaceVar(const Instruction& inst) {
    auto getUnderlyingTypeId = [&](const Instruction* ifxVar) {
      auto pointerTypeInst = _.FindDef(ifxVar->type_id());
      auto typeInst = _.FindDef(pointerTypeInst->GetOperandAs<uint32_t>(2));
      while (typeInst->opcode() == spv::Op::OpTypeArray) {
        typeInst = _.FindDef(typeInst->GetOperandAs<uint32_t>(1));
      };
      return typeInst->id();
    };

    for (const uint32_t entry_point : _.entry_points()) {
      const auto* models = _.GetExecutionModels(entry_point);
      if (models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
          models->find(spv::ExecutionModel::MeshNV) != models->end()) {
        for (const auto& desc : _.entry_point_descriptions(entry_point)) {
          for (auto interface : desc.interfaces) {
            if (inst.opcode() == spv::Op::OpTypeStruct) {
              auto varInst = _.FindDef(interface);
              if (inst.id() == getUnderlyingTypeId(varInst)) return true;
            } else if (inst.id() == interface) {
              return true;
            }
          }
        }
      }
    }
    return false;
  }